

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O1

uchar * unbase64(char *ascii,int len,int *flen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uchar *puVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  if (len < 2) {
    puts("ERROR: You passed an invalid base64 string (too short). You get NULL back.");
    *flen = 0;
  }
  else {
    uVar8 = (ascii[(ulong)(uint)len - 1] == '=') + 1;
    if (ascii[(ulong)(uint)len - 2] != '=') {
      uVar8 = (uint)(ascii[(ulong)(uint)len - 1] == '=');
    }
    iVar4 = ((uint)(len * 3) >> 2) - uVar8;
    *flen = iVar4;
    puVar5 = (uchar *)malloc((long)iVar4);
    if (puVar5 != (uchar *)0x0) {
      uVar9 = (len - uVar8) - 4;
      if ((int)uVar9 < 0) {
        uVar7 = 0;
        lVar6 = 0;
      }
      else {
        uVar7 = 0;
        lVar6 = 0;
        do {
          bVar1 = ""[(byte)ascii[uVar7 + 1]];
          bVar2 = ""[(byte)ascii[uVar7 + 2]];
          bVar3 = ascii[uVar7 + 3];
          puVar5[lVar6] = bVar1 >> 4 | ""[(byte)ascii[uVar7]] << 2;
          puVar5[lVar6 + 1] = bVar2 >> 2 | bVar1 << 4;
          puVar5[lVar6 + 2] = bVar2 << 6 | ""[bVar3];
          lVar6 = lVar6 + 3;
          uVar7 = uVar7 + 4;
        } while (uVar7 <= uVar9);
      }
      if (uVar8 != 2) {
        if (uVar8 != 1) {
          return puVar5;
        }
        uVar7 = uVar7 & 0xffffffff;
        bVar1 = ""[(byte)ascii[uVar7 + 1]];
        bVar2 = ""[(byte)ascii[uVar7 + 2]];
        puVar5[lVar6] = bVar1 >> 4 | ""[(byte)ascii[uVar7]] << 2;
        puVar5[lVar6 + 1] = bVar2 >> 2 | bVar1 << 4;
        return puVar5;
      }
      puVar5[lVar6] =
           ""[(byte)ascii[(uVar7 & 0xffffffff) + 1]] >> 4 | ""[(byte)ascii[uVar7 & 0xffffffff]] << 2
      ;
      return puVar5;
    }
    puts("ERROR: unbase64 could not allocate enough memory.");
    puts("I must stop because I could not get enough");
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char* unbase64(const char* ascii, int len, int *flen) {
	const unsigned char *safeAsciiPtr = (const unsigned char*) ascii;
	unsigned char *bin;
	int cb = 0;
	int charNo;
	int pad = 0;

	if (len < 2) { // 2 accesses below would be OOB.
		// catch empty string, return NULL as result.
		puts(
				"ERROR: You passed an invalid base64 string (too short). You get NULL back.");
		*flen = 0;
		return 0;
	}
	if (safeAsciiPtr[len - 1] == '=')
		++pad;
	if (safeAsciiPtr[len - 2] == '=')
		++pad;

	*flen = 3 * len / 4 - pad;
	bin = (unsigned char*) malloc(*flen);
	if (!bin) {
		puts("ERROR: unbase64 could not allocate enough memory.");
		puts("I must stop because I could not get enough");
		return 0;
	}

	for (charNo = 0; charNo <= len - 4 - pad; charNo += 4) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];
		int D = unb64[safeAsciiPtr[charNo + 3]];

		bin[cb++] = (A << 2) | (B >> 4);
		bin[cb++] = (B << 4) | (C >> 2);
		bin[cb++] = (C << 6) | (D);
	}

	if (pad == 1) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];
		int C = unb64[safeAsciiPtr[charNo + 2]];

		bin[cb++] = (A << 2) | (B >> 4);
		bin[cb++] = (B << 4) | (C >> 2);
	} else if (pad == 2) {
		int A = unb64[safeAsciiPtr[charNo]];
		int B = unb64[safeAsciiPtr[charNo + 1]];

		bin[cb++] = (A << 2) | (B >> 4);
	}

	return bin;
}